

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O2

void __thiscall DBaseStatusBar::BlendView(DBaseStatusBar *this,float *blend)

{
  player_t *ppVar1;
  AActor *pAVar2;
  player_t **pppVar3;
  
  V_AddBlend((float)BaseBlendR / 255.0,(float)BaseBlendG / 255.0,(float)BaseBlendB / 255.0,
             BaseBlendA * underwater_fade_scalar.Value,blend);
  pppVar3 = &this->CPlayer;
  V_AddPlayerBlend(this->CPlayer,blend,1.0,0xe4);
  if (screen->Accel2D == false) {
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)&(*pppVar3)->camera);
    if (((pAVar2 == (AActor *)0x0) || (menuactive != MENU_Off)) || (ConsoleState != c_up))
    goto LAB_004c141d;
  }
  pAVar2 = GC::ReadBarrier<AActor>((AActor **)&(*pppVar3)->camera);
  if (pAVar2 != (AActor *)0x0) {
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)&(*pppVar3)->camera);
    if (pAVar2->player != (player_t *)0x0) {
      pAVar2 = GC::ReadBarrier<AActor>((AActor **)&(*pppVar3)->camera);
      pppVar3 = &pAVar2->player;
    }
  }
  ppVar1 = *pppVar3;
  V_AddBlend(ppVar1->BlendR,ppVar1->BlendG,ppVar1->BlendB,ppVar1->BlendA,blend);
LAB_004c141d:
  V_SetBlend((int)(*blend * 255.0),(int)(blend[1] * 255.0),(int)(blend[2] * 255.0),
             (int)(blend[3] * 256.0));
  return;
}

Assistant:

void DBaseStatusBar::BlendView (float blend[4])
{
	// [Nash] Allow user to set blend intensity
	float cnt = (BaseBlendA * underwater_fade_scalar);

	V_AddBlend (BaseBlendR / 255.f, BaseBlendG / 255.f, BaseBlendB / 255.f, cnt, blend);
	V_AddPlayerBlend(CPlayer, blend, 1.0f, 228);

	if (screen->Accel2D || (CPlayer->camera != NULL && menuactive == MENU_Off && ConsoleState == c_up))
	{
		player_t *player = (CPlayer->camera != NULL && CPlayer->camera->player != NULL) ? CPlayer->camera->player : CPlayer;
		V_AddBlend (player->BlendR, player->BlendG, player->BlendB, player->BlendA, blend);
	}

	V_SetBlend ((int)(blend[0] * 255.0f), (int)(blend[1] * 255.0f),
				(int)(blend[2] * 255.0f), (int)(blend[3] * 256.0f));
}